

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cimgui.cpp
# Opt level: O0

ImVector_ImDrawChannel *
ImVector_ImDrawChannel_ImVector_ImDrawChannelVector(ImVector_ImDrawChannel *src)

{
  ImVector<ImDrawChannel> *this;
  ImVector_ImDrawChannel *src_local;
  
  ImGui::MemAlloc(0x10);
  this = (ImVector<ImDrawChannel> *)operator_new(0x10);
  ImVector<ImDrawChannel>::ImVector(this,src);
  return this;
}

Assistant:

CIMGUI_API ImVector_ImDrawChannel* ImVector_ImDrawChannel_ImVector_ImDrawChannelVector(const ImVector_ImDrawChannel src)
{
    return IM_NEW(ImVector_ImDrawChannel)(src);
}